

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledBox.cpp
# Opt level: O1

SharedPtr<Decorator> __thiscall
Rml::DecoratorTiledBoxInstancer::InstanceDecorator
          (DecoratorTiledBoxInstancer *this,String *param_1,PropertyDictionary *properties,
          DecoratorInstancerInterface *instancer_interface)

{
  undefined1 auVar1 [8];
  bool bVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  DecoratorInstancerInterface *in_R8;
  long lVar4;
  SharedPtr<Decorator> SVar5;
  SharedPtr<Rml::DecoratorTiledBox> decorator;
  Texture textures [9];
  Tile tiles [9];
  undefined1 local_379;
  undefined1 local_378 [8];
  undefined1 local_370 [8];
  Texture local_368 [9];
  Tile local_2d8 [9];
  
  lVar4 = 0;
  do {
    DecoratorTiled::Tile::Tile
              ((Tile *)((long)(&((Tile *)(&((Tile *)(&local_2d8[0].tile_data + -1))->tile_data + -1)
                                )->tile_data + 0xffffffffffffffff) + lVar4));
    lVar4 = lVar4 + 0x4c;
  } while (lVar4 != 0x2ac);
  lVar4 = 0xc;
  do {
    *(undefined8 *)(local_378 + lVar4 + 4) = 0;
    *(undefined8 *)((long)local_368 + lVar4 + -4) = 0xffffffffffffffff;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x9c);
  bVar2 = DecoratorTiledInstancer::GetTileProperties
                    ((DecoratorTiledInstancer *)param_1,local_2d8,local_368,9,
                     (PropertyDictionary *)instancer_interface,in_R8);
  if (bVar2) {
    local_378 = (undefined1  [8])0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Rml::DecoratorTiledBox,std::allocator<Rml::DecoratorTiledBox>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_370,
               (DecoratorTiledBox **)local_378,(allocator<Rml::DecoratorTiledBox> *)&local_379);
    bVar2 = DecoratorTiledBox::Initialise((DecoratorTiledBox *)local_378,local_2d8,local_368);
    auVar1 = local_370;
    if (bVar2) {
      (this->super_DecoratorTiledInstancer).super_DecoratorInstancer._vptr_DecoratorInstancer =
           (_func_int **)local_378;
      (this->super_DecoratorTiledInstancer).super_DecoratorInstancer.super_EffectSpecification.
      properties.properties.
      super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_370 = (undefined1  [8])0x0;
      (this->super_DecoratorTiledInstancer).super_DecoratorInstancer.super_EffectSpecification.
      properties.properties.
      super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar1;
      local_378 = (undefined1  [8])0x0;
    }
    else {
      (this->super_DecoratorTiledInstancer).super_DecoratorInstancer._vptr_DecoratorInstancer =
           (_func_int **)0x0;
      (this->super_DecoratorTiledInstancer).super_DecoratorInstancer.super_EffectSpecification.
      properties.properties.
      super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
    _Var3._M_pi = extraout_RDX_00;
    if (local_370 != (undefined1  [8])0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_370);
      _Var3._M_pi = extraout_RDX_01;
    }
  }
  else {
    (this->super_DecoratorTiledInstancer).super_DecoratorInstancer._vptr_DecoratorInstancer =
         (_func_int **)0x0;
    (this->super_DecoratorTiledInstancer).super_DecoratorInstancer.super_EffectSpecification.
    properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    _Var3._M_pi = extraout_RDX;
  }
  SVar5.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  SVar5.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (SharedPtr<Decorator>)SVar5.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Decorator> DecoratorTiledBoxInstancer::InstanceDecorator(const String& /*name*/, const PropertyDictionary& properties,
	const DecoratorInstancerInterface& instancer_interface)
{
	constexpr size_t num_tiles = 9;

	DecoratorTiled::Tile tiles[num_tiles];
	Texture textures[num_tiles];

	if (!GetTileProperties(tiles, textures, num_tiles, properties, instancer_interface))
		return nullptr;

	auto decorator = MakeShared<DecoratorTiledBox>();
	if (!decorator->Initialise(tiles, textures))
		return nullptr;

	return decorator;
}